

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcDebugGetSourceLocationModuleIndex(char *sourceLocation)

{
  ExternModuleInfo *pEVar1;
  char *pcVar2;
  char *end;
  char *start;
  ExternModuleInfo *moduleInfo;
  uint i;
  char *fullSource;
  ExternModuleInfo *modules;
  char *pcStack_18;
  uint moduleCount;
  char *sourceLocation_local;
  
  if (sourceLocation != (char *)0x0) {
    modules._4_4_ = 0;
    pcStack_18 = sourceLocation;
    pEVar1 = nullcDebugModuleInfo((uint *)((long)&modules + 4));
    pcVar2 = nullcDebugSource();
    for (moduleInfo._4_4_ = 0; moduleInfo._4_4_ < modules._4_4_;
        moduleInfo._4_4_ = moduleInfo._4_4_ + 1) {
      if ((pcVar2 + pEVar1[moduleInfo._4_4_].sourceOffset <= pcStack_18) &&
         (pcStack_18 <
          pcVar2 + pEVar1[moduleInfo._4_4_].sourceOffset + pEVar1[moduleInfo._4_4_].sourceSize)) {
        return moduleInfo._4_4_;
      }
    }
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcDebugGetSourceLocationModuleIndex(const char *sourceLocation)
{
	if(!sourceLocation)
		return ~0u;

	unsigned moduleCount = 0;
	ExternModuleInfo *modules = nullcDebugModuleInfo(&moduleCount);

	const char* fullSource = nullcDebugSource();

	for(unsigned i = 0; i < moduleCount; i++)
	{
		ExternModuleInfo &moduleInfo = modules[i];

		const char *start = fullSource + moduleInfo.sourceOffset;
		const char *end = start + moduleInfo.sourceSize;

		if(sourceLocation >= start && sourceLocation < end)
			return i;
	}

	return ~0u;
}